

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
          (Marray<int,_std::allocator<unsigned_long>_> *this)

{
  operator_delete((this->super_View<int,_false,_std::allocator<unsigned_long>_>).data_,
                  (this->super_View<int,_false,_std::allocator<unsigned_long>_>).geometry_.size_ <<
                  2);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&(this->super_View<int,_false,_std::allocator<unsigned_long>_>).geometry_);
  return;
}

Assistant:

inline
Marray<T, A>::~Marray()
{
    dataAllocator_.deallocate(this->data_, this->size());
}